

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ConcurrentAssertionMemberSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConcurrentAssertionMemberSyntax,slang::syntax::ConcurrentAssertionMemberSyntax_const&>
          (BumpAllocator *this,ConcurrentAssertionMemberSyntax *args)

{
  ConcurrentAssertionMemberSyntax *pCVar1;
  ConcurrentAssertionMemberSyntax *in_RSI;
  size_t in_RDI;
  size_t unaff_retaddr;
  
  pCVar1 = (ConcurrentAssertionMemberSyntax *)allocate((BumpAllocator *)args,unaff_retaddr,in_RDI);
  slang::syntax::ConcurrentAssertionMemberSyntax::ConcurrentAssertionMemberSyntax(in_RSI,pCVar1);
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }